

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.cpp
# Opt level: O0

SchemaCatalogEntry * __thiscall
duckdb::Catalog::GetSchema(Catalog *this,ClientContext *context,string *schema)

{
  SchemaCatalogEntry *pSVar1;
  string *in_stack_00000018;
  Catalog *in_stack_00000020;
  CatalogTransaction in_stack_00000030;
  ClientContext *in_stack_ffffffffffffff88;
  Catalog *in_stack_ffffffffffffff90;
  
  GetCatalogTransaction(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  pSVar1 = GetSchema(in_stack_00000020,in_stack_00000030,in_stack_00000018);
  return pSVar1;
}

Assistant:

SchemaCatalogEntry &Catalog::GetSchema(ClientContext &context, const string &schema) {
	return GetSchema(GetCatalogTransaction(context), schema);
}